

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_ElementsSegwitAddressFromStringTest_Test::TestBody
          (Address_ElementsSegwitAddressFromStringTest_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  AssertHelperData *pAVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> params;
  Address address;
  AssertHelper local_358;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  AssertHelper local_348;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_340;
  char *local_338 [2];
  Script local_328;
  void *local_2e0;
  void *local_2c8;
  code *local_2b0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_238;
  Script local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  string local_1b0 [24];
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined1 *local_188;
  undefined1 local_178 [16];
  void *local_168;
  void *local_160;
  void *local_150;
  void *local_148;
  void *local_138;
  code *local_120 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  cfd::core::Address::Address((Address *)&local_198);
  ppuVar1 = (pointer *)
            ((long)&local_328.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_328._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,
             "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]"
             ,"");
  cfd::core::AddressFormatData::ConvertListFromJson(local_1b0);
  if (local_328._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_328._vptr_Script);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_348.data_ = (AssertHelperData *)local_338;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6","");
      cfd::core::Address::Address((Address *)&local_328,(string *)&local_348,(vector *)local_1b0);
      cfd::core::Address::operator=((Address *)&local_198,(Address *)&local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_328.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(local_328.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
          local_328.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != &local_328.script_stack_) {
        operator_delete(local_328.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      if (local_348.data_ != (AssertHelperData *)local_338) {
        operator_delete(local_348.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2e2,
               "Expected: (address = Address(\"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6\", params)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6\"",
             "address.GetAddress().c_str()","ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
             (char *)local_328._vptr_Script);
  if (local_328._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_328._vptr_Script);
  }
  if (local_348.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (sStack_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2e4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_._0_4_ = 4;
  local_358.data_._0_4_ = local_198;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_328,"NetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_348,(NetType *)&local_358);
  if ((char)local_328._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_348);
    if (local_328.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_328.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2e6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_348.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_348.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_348.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_._0_4_ = 4;
  local_358.data_._0_4_ = local_194;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&local_328,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if ((char)local_328._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_348);
    if (local_328.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_328.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2ea,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_348.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_348.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_348.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_ = local_348.data_ & 0xffffffff00000000;
  local_358.data_._0_4_ = local_190;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_328,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if ((char)local_328._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_348);
    if (local_328.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_328.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2eb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_348.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_348.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_348.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_ = (AssertHelperData *)0x0;
  sStack_340.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_338[0] = (char *)0x0;
  uVar4 = (long)local_160 - (long)local_168;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_160 - (long)local_168;
  }
  local_338[0] = (char *)(uVar4 + (long)pAVar3);
  local_348.data_ = pAVar3;
  if (local_160 != local_168) {
    sStack_340.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_168,sVar6);
  }
  sStack_340.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)local_328._vptr_Script);
  if (local_328._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_328._vptr_Script);
  }
  if (local_348.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_348.data_);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_350.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2ed,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_ = (AssertHelperData *)0x0;
  sStack_340.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_338[0] = (char *)0x0;
  uVar4 = (long)local_148 - (long)local_150;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_148 - (long)local_150;
  }
  local_338[0] = (char *)(uVar4 + (long)pAVar3);
  local_348.data_ = pAVar3;
  if (local_148 != local_150) {
    sStack_340.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_150,sVar6);
  }
  sStack_340.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)local_328._vptr_Script);
  if (local_328._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_328._vptr_Script);
  }
  if (local_348.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_348.data_);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_350.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2ee,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script(&local_328,&local_90);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"\"","address.GetScript().GetHex().c_str()","",
             (char *)local_348.data_);
  if (local_348.data_ != (AssertHelperData *)local_338) {
    operator_delete(local_348.data_);
  }
  cfd::core::Script::~Script(&local_328);
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (local_350.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2ef,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_348.data_ = (AssertHelperData *)local_338;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,
                 "ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4","");
      cfd::core::Address::Address((Address *)&local_328,(string *)&local_348,(vector *)local_1b0);
      cfd::core::Address::operator=((Address *)&local_198,(Address *)&local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_328.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(local_328.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
          local_328.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != &local_328.script_stack_) {
        operator_delete(local_328.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      if (local_348.data_ != (AssertHelperData *)local_338) {
        operator_delete(local_348.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2f1,
               "Expected: (address = Address(\"ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4\", params)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4\"",
             "address.GetAddress().c_str()",
             "ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4",
             (char *)local_328._vptr_Script);
  if (local_328._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_328._vptr_Script);
  }
  if (local_348.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_328);
    if (sStack_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2f3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_328._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_328._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_328._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_._0_4_ = 4;
  local_358.data_._0_4_ = local_198;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_328,"NetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_348,(NetType *)&local_358);
  if ((char)local_328._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_348);
    if (local_328.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_328.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2f5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_348.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_348.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_348.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_._0_4_ = 3;
  local_358.data_._0_4_ = local_194;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&local_328,"AddressType::kP2wshAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if ((char)local_328._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_348);
    if (local_328.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_328.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2f9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_348.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_348.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_348.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348.data_ = local_348.data_ & 0xffffffff00000000;
  local_358.data_._0_4_ = local_190;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_328,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if ((char)local_328._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_348);
    if (local_328.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_328.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2fa,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (local_348.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_348.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_348.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_328.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_1b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  cfd::core::Script::~Script(&local_90);
  local_120[0] = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_120);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138);
  }
  if (local_150 != (void *)0x0) {
    operator_delete(local_150);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  return;
}

Assistant:

TEST(Address, ElementsSegwitAddressFromStringTest) {
  Address address;
  std::vector<AddressFormatData> params = AddressFormatData::ConvertListFromJson(
      "[{\"nettype\":\"Test\",\"p2pkh\":\"ff\",\"p2sh\":\"ff\",\"bech32\":\"dmy\"},"
      "{\"nettype\":\"elementsregtest\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"},]");

  EXPECT_NO_THROW((address = Address("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6", params)));
  EXPECT_STREQ("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4", params)));
  EXPECT_STREQ("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4",
               address.GetAddress().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_EQ(NetType::kElementsRegtest, address.GetNetType());
#else
  EXPECT_EQ(NetType::kNetTypeNum, address.GetNetType());
#endif  // CFD_DISABLE_ELEMENTS
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
}